

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::inputevent(uint argc)

{
  int32_t iVar1;
  int iVar2;
  vm_obj_id_t vVar3;
  vm_val_t *pvVar4;
  int in_EDI;
  char buf [20];
  size_t len;
  char c [4];
  int from_script;
  vm_val_t val;
  char keyname [32];
  CVmObjList *lst;
  vm_obj_id_t lst_obj;
  int ele_count;
  int evt;
  os_event_info_t info;
  unsigned_long timeout;
  int use_timeout;
  undefined8 in_stack_fffffffffffffde8;
  char *pcVar5;
  uint in_stack_fffffffffffffdf0;
  uint in_stack_fffffffffffffdf4;
  os_event_info_t *in_stack_fffffffffffffdf8;
  CVmConsoleMain *pCVar6;
  char *in_stack_fffffffffffffe00;
  int *in_stack_fffffffffffffe08;
  CVmConsole *in_stack_fffffffffffffe10;
  CVmConsole *this;
  char *in_stack_fffffffffffffe18;
  int *in_stack_fffffffffffffe20;
  CVmConsole *in_stack_fffffffffffffe28;
  unsigned_long *in_stack_fffffffffffffe40;
  char local_188 [32];
  ulong local_168;
  undefined1 local_160 [4];
  int local_15c;
  vm_val_t local_158;
  char local_148 [32];
  CVmObject *local_128;
  vm_obj_id_t local_11c;
  undefined4 local_118;
  int local_114;
  CVmConsole local_110 [4];
  long local_10;
  undefined4 local_8;
  int local_4;
  
  local_15c = 0;
  local_4 = in_EDI;
  CVmBif::check_argc_range
            (in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0,
             (uint)((ulong)in_stack_fffffffffffffde8 >> 0x20));
  if (local_4 == 0) {
    local_8 = 0;
    local_10 = 0;
  }
  else {
    pvVar4 = CVmStack::get(0);
    if (pvVar4->typ == VM_NIL) {
      local_8 = 0;
      local_10 = 0;
      CVmStack::discard();
    }
    else {
      iVar1 = CVmBif::pop_long_val();
      local_10 = (long)iVar1;
      local_8 = 1;
    }
  }
  pcVar5 = (char *)0x0;
  iVar2 = CVmConsole::read_event_script
                    (in_stack_fffffffffffffe28,in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,
                     (size_t)in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,
                     (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),in_stack_fffffffffffffe40);
  if (iVar2 == 0) {
    if (G_net_config_X == (TadsNetConfig *)0x0) {
      (*(G_console_X->super_CVmConsole)._vptr_CVmConsole[3])(G_console_X,1);
      CVmConsole::reset_line_count
                ((CVmConsole *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
                 (int)((ulong)pcVar5 >> 0x20));
      local_114 = os_get_event((unsigned_long)in_stack_fffffffffffffe08,
                               (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                               in_stack_fffffffffffffdf8);
    }
    else {
      local_114 = 5;
    }
  }
  else {
    local_15c = 1;
    if (local_114 == 0x100) {
      local_110[0]._vptr_CVmConsole._0_4_ = atoi((char *)local_110);
    }
  }
  if (local_114 == 1) {
    local_118 = 2;
  }
  else if (local_114 == 3) {
    local_118 = 2;
  }
  else if (local_114 == 0x100) {
    local_118 = 2;
  }
  else {
    local_118 = 1;
  }
  local_11c = CVmObjList::create(in_stack_fffffffffffffdf4,(size_t)pcVar5);
  local_128 = vm_objp(0);
  CVmObjList::cons_clear
            ((CVmObjList *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  vm_val_t::set_obj(&local_158,local_11c);
  CVmStack::push(&local_158);
  vm_val_t::set_int(&local_158,local_114);
  CVmObjList::cons_set_element
            ((CVmObjList *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
             (size_t)pcVar5,(vm_val_t *)0x3024d5);
  if (local_114 == 1) {
    if (local_15c == 0) {
      if ((uint)local_110[0]._vptr_CVmConsole == 0) {
        map_ext_key(pcVar5,0);
        iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
        strlen(local_148);
        vVar3 = CVmObjString::create
                          ((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                           in_stack_fffffffffffffdf8->href,
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        vm_val_t::set_obj(&local_158,vVar3);
        strlen(local_148);
        CVmConsole::log_event
                  (in_stack_fffffffffffffe10,iVar2,in_stack_fffffffffffffe00,
                   (size_t)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
      }
      else {
        local_160[0] = (undefined1)(uint)local_110[0]._vptr_CVmConsole;
        local_168 = 1;
        while ((iVar2 = raw_key_complete((char *)CONCAT44(in_stack_fffffffffffffdf4,
                                                          in_stack_fffffffffffffdf0),(size_t)pcVar5)
               , iVar2 == 0 && local_168 < 4 &&
               (local_114 = os_get_event((unsigned_long)in_stack_fffffffffffffe08,
                                         (int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                                         in_stack_fffffffffffffdf8), local_114 == 1))) {
          local_160[local_168] = (char)(uint)local_110[0]._vptr_CVmConsole;
          local_168 = local_168 + 1;
        }
        map_raw_key((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                    (size_t)in_stack_fffffffffffffdf8);
        iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
        strlen(local_148);
        vVar3 = CVmObjString::create
                          ((int)((ulong)in_stack_fffffffffffffe00 >> 0x20),
                           in_stack_fffffffffffffdf8->href,
                           CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
        vm_val_t::set_obj(&local_158,vVar3);
        strlen(local_148);
        CVmConsole::log_event
                  (in_stack_fffffffffffffe10,iVar2,in_stack_fffffffffffffe00,
                   (size_t)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
      }
    }
    else {
      vVar3 = CVmBif::str_from_ui_str
                        ((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
      iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
      vm_val_t::set_obj(&local_158,vVar3);
      strlen((char *)local_110);
      CVmConsole::log_event
                (in_stack_fffffffffffffe10,iVar2,in_stack_fffffffffffffe00,
                 (size_t)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
    }
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (size_t)pcVar5,(vm_val_t *)0x302781);
  }
  else if (local_114 == 3) {
    vVar3 = CVmBif::str_from_ui_str
                      ((char *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
    vm_val_t::set_obj(&local_158,vVar3);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (size_t)pcVar5,(vm_val_t *)0x3027bc);
    this = local_110;
    pCVar6 = G_console_X;
    strlen((char *)local_110);
    CVmConsole::log_event
              (this,(int)((ulong)pCVar6 >> 0x20),in_stack_fffffffffffffe00,
               (size_t)in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf4);
  }
  else if (local_114 == 0x100) {
    vm_val_t::set_int(&local_158,(uint)local_110[0]._vptr_CVmConsole);
    iVar2 = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    CVmObjList::cons_set_element
              ((CVmObjList *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (size_t)pcVar5,(vm_val_t *)0x302832);
    sprintf(local_188,"%d",(ulong)(uint)local_110[0]._vptr_CVmConsole);
    pcVar5 = local_188;
    pCVar6 = G_console_X;
    strlen(local_188);
    CVmConsole::log_event
              (in_stack_fffffffffffffe10,iVar2,pcVar5,(size_t)pCVar6,in_stack_fffffffffffffdf4);
  }
  else {
    CVmConsole::log_event
              ((CVmConsole *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0),
               (int)((ulong)pcVar5 >> 0x20));
  }
  CVmBif::retval_obj(0);
  CVmStack::discard();
  return;
}

Assistant:

void CVmBifTIO::inputevent(VMG_ uint argc)
{
    int use_timeout;
    unsigned long timeout;
    os_event_info_t info;
    int evt;
    int ele_count;
    vm_obj_id_t lst_obj;
    CVmObjList *lst;
    char keyname[32];
    vm_val_t val;
    int from_script = FALSE;
    static const int filter[] =
    {
        OS_EVT_KEY, OS_EVT_TIMEOUT, OS_EVT_NOTIMEOUT,
        OS_EVT_HREF, OS_EVT_EOF, OS_EVT_COMMAND
    };

    /* check arguments */
    check_argc_range(vmg_ argc, 0, 1);

    /* if there's a timeout argument, get it */
    if (argc == 0)
    {
        /* there's no timeout */
        use_timeout = FALSE;
        timeout = 0;
    }
    else if (G_stk->get(0)->typ == VM_NIL)
    {
        /* the timeout is nil, which is the same as no timeout */
        use_timeout = FALSE;
        timeout = 0;

        /* discard the nil timeout value */
        G_stk->discard();
    }
    else
    {
        /* pop the timeout value */
        timeout = pop_long_val(vmg0_);

        /* note that we have a timeout to use */
        use_timeout = TRUE;
    }

    /* check for script input */
    if (G_console->read_event_script(
        vmg_ &evt, info.href, sizeof(info.href),
        filter, sizeof(filter)/sizeof(filter[0]), 0))
    {
        /* we got a script event - note it */
        from_script = TRUE;

        /* translate certain events */
        switch (evt)
        {
        case OS_EVT_COMMAND:
            /* read the numeric parameter */
            info.cmd_id = atoi(info.href);
            break;
        }
    }
    else if (G_net_config != 0)
    {
        /* there's no console in web host mode - return eof */
        evt = OS_EVT_EOF;
    }
    else
    {
        /* flush any buffered output */
        G_console->flush_all(vmg_ VM_NL_INPUT);

        /* reset the [MORE] counter */
        G_console->reset_line_count(FALSE);

        /* read an event from the OS layer */
        evt = os_get_event(timeout, use_timeout, &info);
    }

    /* figure out how big a list we need to allocate */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* 
         *   we need two elements - one for the event type code, one for the
         *   keystroke string 
         */
        ele_count = 2;
        break;

    case OS_EVT_COMMAND:
        /* we need a second element for the command ID */
        ele_count = 2;
        break;

    case OS_EVT_HREF:
        /* 
         *   we need two elements - one for the event type code, one for the
         *   HREF string 
         */
        ele_count = 2;
        break;

    default:
        /* for anything else, we need only the event type code element */
        ele_count = 1;
        break;
    }

    /* create the return list */
    lst_obj = CVmObjList::create(vmg_ FALSE, ele_count);
    lst = (CVmObjList *)vm_objp(vmg_ lst_obj);
    lst->cons_clear();

    /* save the list on the stack to protect against garbage collection */
    val.set_obj(lst_obj);
    G_stk->push(&val);

    /* fill in the first element with the event type code */
    val.set_int(evt);
    lst->cons_set_element(0, &val);

    /* set additional elements, according to the event type */
    switch(evt)
    {
    case OS_EVT_KEY:
        /* map the extended or ordinary key, as appropriate */
        if (from_script)
        {
            /* we got a key from the script - it's in the 'href' field */
            val.set_obj(str_from_ui_str(vmg_ info.href));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, info.href, strlen(info.href), FALSE);
        }
        else if (info.key[0] == 0)
        {
            /* it's an extended key */
            map_ext_key(vmg_ keyname, info.key[1]);

            /* create a string for the key name */
            val.set_obj(CVmObjString::create(
                vmg_ FALSE, keyname, strlen(keyname)));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, keyname, strlen(keyname), TRUE);
        }
        else
        {
            char c[4];
            size_t len;

            /* fetch more bytes until we have a complete character */
            for (c[0] = (char)info.key[0], len = 1 ;
                 !raw_key_complete(vmg_ c, len) && len < sizeof(c) ; )
            {
                /* 
                 *   Read another input event.  The keyboard driver should
                 *   already have queued up all of the bytes needed to
                 *   complete this character sequence, so there should never
                 *   be a delay from os_get_event() here - it should simply
                 *   return immediately with another OS_EVT_KEY event with
                 *   the next byte of the sequence.  
                 */
                evt = os_get_event(0, FALSE, &info);

                /* 
                 *   if it's not a keystroke event, something's wrong -
                 *   ignore the event and stop trying to read the remaining
                 *   bytes of the character sequence 
                 */
                if (evt != OS_EVT_KEY)
                    break;

                /* store the next byte of the sequence */
                c[len++] = (char)info.key[0];
            }

            /* it's an ordinary key - map it */
            map_raw_key(vmg_ keyname, c, len);

            /* create a string for the key name */
            val.set_obj(CVmObjString::create(
                vmg_ FALSE, keyname, strlen(keyname)));

            /* log the event */
            G_console->log_event(
                vmg_ OS_EVT_KEY, keyname, strlen(keyname), TRUE);
        }

        /* add it to the list */
        lst->cons_set_element(1, &val);

        break;

    case OS_EVT_HREF:
        /* create the string for the href text */
        val.set_obj(str_from_ui_str(vmg_ info.href));

        /* add it to the list */
        lst->cons_set_element(1, &val);

        /* log it */
        G_console->log_event(vmg_ OS_EVT_HREF,
                             info.href, strlen(info.href), FALSE);
        break;

    case OS_EVT_COMMAND:
        /* the second element is the command ID code */
        val.set_int(info.cmd_id);
        lst->cons_set_element(1, &val);

        /* log it */
        {
            char buf[20];
            sprintf(buf, "%d", info.cmd_id);
            G_console->log_event(vmg_ OS_EVT_COMMAND,
                                 buf, strlen(buf), TRUE);
        }
        break;

    default:
        /* other event types have no extra data */
        G_console->log_event(vmg_ evt);
        break;
    }

    /* return the list */
    retval_obj(vmg_ lst_obj);

    /* we can drop the garbage collection protection now */
    G_stk->discard();
}